

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::SimpSolver(SimpSolver *this)

{
  ClauseAllocator *this_00;
  bool bVar1;
  CRef CVar2;
  vec<Minisat::Lit> dummy;
  vec<Minisat::Lit> local_38;
  
  Solver::Solver(&this->super_Solver);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_00138c98;
  bVar1 = updateOptions();
  this->simp_reparsed_options = bVar1;
  this->parsing = false;
  this->grow = opt_grow.value;
  this->clause_lim = opt_clause_lim.value;
  this->subsumption_lim = opt_subsumption_lim.value;
  this->simp_garbage_frac = opt_simp_garbage_frac.value;
  this->max_simp_steps = opt_max_simplify_step.value;
  this->nr_max_simp_cls = opt_max_simp_cls.value;
  this->use_asymm = opt_use_asymm.value;
  this->use_rcheck = opt_use_rcheck.value;
  this->use_elim = opt_use_elim.value;
  this->merges = 0;
  this->asymm_lits = 0;
  this->eliminated_vars = 0;
  this->elimorder = 1;
  this->use_simplification = true;
  this_00 = &(this->super_Solver).ca;
  (this->elimclauses).data = (uint *)0x0;
  (this->elimclauses).sz = 0;
  (this->elimclauses).cap = 0;
  (this->touched).data = (char *)0x0;
  (this->touched).sz = 0;
  (this->touched).cap = 0;
  (this->occurs).occs.data = (vec<unsigned_int> *)0x0;
  (this->occurs).occs.sz = 0;
  (this->occurs).occs.cap = 0;
  (this->occurs).dirty.data = (char *)0x0;
  (this->occurs).dirty.sz = 0;
  (this->occurs).dirty.cap = 0;
  (this->occurs).dirties.data = (int *)0x0;
  (this->occurs).dirties.sz = 0;
  (this->occurs).dirties.cap = 0;
  (this->occurs).deleted.ca = this_00;
  (this->n_occ).data = (int *)0x0;
  (this->n_occ).sz = 0;
  (this->n_occ).cap = 0;
  (this->elim_heap).lt.n_occ = &this->n_occ;
  (this->elim_heap).heap.data = (int *)0x0;
  (this->elim_heap).heap.sz = 0;
  (this->elim_heap).heap.cap = 0;
  (this->elim_heap).indices.data = (int *)0x0;
  (this->elim_heap).indices.sz = 0;
  (this->elim_heap).indices.cap = 0;
  (this->subsumption_queue).buf.data = (uint *)0x0;
  (this->subsumption_queue).buf.sz = 0;
  (this->subsumption_queue).buf.cap = 0;
  vec<unsigned_int>::growTo(&(this->subsumption_queue).buf,1);
  (this->merge_count_cls).data = (Lit *)0x0;
  (this->merge_count_cls).sz = 0;
  (this->merge_count_cls).cap = 0;
  (this->subsumption_queue).first = 0;
  (this->subsumption_queue).end = 0;
  (this->frozen).data = (char *)0x0;
  (this->frozen).sz = 0;
  (this->frozen).cap = 0;
  (this->eliminated).data = (char *)0x0;
  (this->eliminated).sz = 0;
  (this->eliminated).cap = 0;
  this->bwdsub_assigns = 0;
  this->n_touched = 0;
  local_38.data = (Lit *)0x0;
  local_38.sz = 0;
  local_38.cap = 0;
  vec<Minisat::Lit>::growTo(&local_38,1,(Lit *)&lit_Undef);
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 1;
  CVar2 = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(this_00,&local_38,false);
  this->bwdsub_tmpunit = CVar2;
  (this->super_Solver).remove_satisfied = false;
  if (local_38.data != (Lit *)0x0) {
    local_38._8_8_ = local_38._8_8_ & 0xffffffff00000000;
    free(local_38.data);
  }
  return;
}

Assistant:

SimpSolver::SimpSolver()
  : simp_reparsed_options(updateOptions())
  , parsing(false)
  , grow(opt_grow)
  , clause_lim(opt_clause_lim)
  , subsumption_lim(opt_subsumption_lim)
  , simp_garbage_frac(opt_simp_garbage_frac)
  , max_simp_steps(opt_max_simplify_step)
  , nr_max_simp_cls(opt_max_simp_cls)
  , use_asymm(opt_use_asymm)
  , use_rcheck(opt_use_rcheck)
  , use_elim(opt_use_elim)
  , merges(0)
  , asymm_lits(0)
  , eliminated_vars(0)
  , elimorder(1)
  , use_simplification(true)
  , occurs(ClauseDeleted(ca))
  , elim_heap(ElimLt(n_occ))
  , bwdsub_assigns(0)
  , n_touched(0)
{
    vec<Lit> dummy(1, lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit = ca.alloc(dummy);
    remove_satisfied = false;
}